

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

FromBase64Result *
QByteArray::fromBase64Encoding
          (FromBase64Result *__return_storage_ptr__,QByteArray *base64,Base64Options options)

{
  qsizetype qVar1;
  Data *pDVar2;
  char *output;
  char *pcVar3;
  long in_FS_OFFSET;
  fromBase64_helper_result fVar4;
  QArrayDataPointer<char> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  qVar1 = (base64->d).size;
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray((QByteArray *)&local_48,(ulong)(qVar1 * 3) >> 2,Uninitialized);
  pcVar3 = (base64->d).ptr;
  if (pcVar3 == (char *)0x0) {
    pcVar3 = &_empty;
  }
  output = local_48.ptr;
  if (local_48.ptr == (char *)0x0) {
    output = &_empty;
  }
  fVar4 = anon_unknown.dwarf_aef3eb::fromBase64_helper(pcVar3,qVar1,output,options);
  truncate((QByteArray *)&local_48,(char *)fVar4.decodedLength,fVar4._8_8_);
  qVar1 = local_48.size;
  pcVar3 = local_48.ptr;
  pDVar2 = local_48.d;
  local_48.d = (Data *)0x0;
  local_48.ptr = (char *)0x0;
  local_48.size = 0;
  (__return_storage_ptr__->decoded).d.d = pDVar2;
  (__return_storage_ptr__->decoded).d.ptr = pcVar3;
  (__return_storage_ptr__->decoded).d.size = qVar1;
  __return_storage_ptr__->decodingStatus = fVar4.status;
  QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray::FromBase64Result QByteArray::fromBase64Encoding(const QByteArray &base64, Base64Options options)
{
    const auto base64Size = base64.size();
    QByteArray result((base64Size * 3) / 4, Qt::Uninitialized);
    const auto base64result = fromBase64_helper(base64.data(),
                                                base64Size,
                                                const_cast<char *>(result.constData()),
                                                options);
    result.truncate(base64result.decodedLength);
    return { std::move(result), base64result.status };
}